

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

void __thiscall helics::apps::AppTextParser::AppTextParser(AppTextParser *this,string *filename)

{
  this->mLineComment = false;
  std::ifstream::ifstream(&this->filePtr,(string *)filename,_S_in);
  (this->configStr)._M_dataplus._M_p = (pointer)&(this->configStr).field_2;
  (this->configStr)._M_string_length = 0;
  (this->configStr).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->mFileName,filename);
  this->currentLineNumber = 0;
  return;
}

Assistant:

AppTextParser::AppTextParser(const std::string& filename): filePtr(filename), mFileName(filename) {}